

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::getTimingTagsKernel
          (CLIntercept *this,cl_command_queue queue,cl_kernel kernel,cl_uint workDim,size_t *gwo,
          size_t *gws,size_t *lws,string *hostTag,string *deviceTag)

{
  cl_int cVar1;
  cl_icd_dispatch *pcVar2;
  SConfig *pSVar3;
  CLdispatchX *pCVar4;
  ostream *poVar5;
  uint in_ECX;
  cl_kernel in_RDX;
  cl_command_queue in_RSI;
  CLIntercept *in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  ulong *in_stack_00000008;
  string *in_stack_00000010;
  string *in_stack_00000018;
  ostringstream ss_3;
  cl_int testErrorCode_1;
  CLdispatchX *dispatchX_2;
  cl_int testErrorCode;
  CLdispatchX *dispatchX_1;
  cl_platform_id platform_1;
  size_t emptyGWO [3];
  size_t suggestedLWS [3];
  bool useSuggestedLWS;
  ostringstream ss_2;
  ostringstream ss_1;
  cl_ulong spill;
  cl_ulong tpm;
  cl_ulong slm;
  cl_uint regCount;
  CLdispatchX *dispatchX;
  cl_platform_id platform;
  size_t kwgs;
  cl_uint queryWorkDim;
  size_t *queryLWS;
  size_t simd;
  size_t pwgsm;
  size_t maxsgs;
  ostringstream ss;
  SDeviceInfo *deviceInfo;
  cl_device_id device;
  lock_guard<std::mutex> lock;
  cl_device_id in_stack_fffffffffffff638;
  CLIntercept *in_stack_fffffffffffff640;
  cl_platform_id in_stack_fffffffffffff650;
  CLIntercept *in_stack_fffffffffffff658;
  ulong *local_998;
  key_type *in_stack_fffffffffffff678;
  map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
  *in_stack_fffffffffffff680;
  ulong local_898;
  ulong local_890;
  ulong local_888;
  cl_kernel in_stack_fffffffffffff780;
  CLIntercept *in_stack_fffffffffffff788;
  string local_818 [32];
  ostringstream local_7f8 [112];
  cl_device_id in_stack_fffffffffffff878;
  CLIntercept *in_stack_fffffffffffff880;
  allocator local_669;
  string local_668 [36];
  cl_int local_644;
  CLdispatchX *local_640;
  allocator local_631;
  string local_630 [32];
  cl_platform_id local_610;
  size_t local_608 [4];
  size_t local_5e8 [3];
  byte local_5c9;
  string local_5c8 [32];
  ostringstream local_5a8 [376];
  string local_430 [32];
  ostringstream local_410 [40];
  string *in_stack_fffffffffffffc18;
  cl_platform_id in_stack_fffffffffffffc20;
  CLIntercept *in_stack_fffffffffffffc28;
  string local_298 [32];
  ulong local_278;
  ulong local_270;
  ulong local_268;
  uint local_25c;
  CLdispatchX *local_258;
  allocator local_249;
  string local_248 [32];
  cl_platform_id local_228;
  ulong local_220;
  uint local_214;
  ulong *local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ostringstream local_1f0 [376];
  mapped_type *local_78;
  string local_70 [48];
  cl_device_id local_40 [2];
  ulong *local_30;
  ulong *local_28;
  uint local_1c;
  cl_kernel local_18;
  cl_command_queue local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffff640,
             (mutex_type *)in_stack_fffffffffffff638);
  local_40[0] = (cl_device_id)0x0;
  pcVar2 = dispatch(in_RDI);
  (*pcVar2->clGetCommandQueueInfo)(local_10,0x1091,8,local_40,(size_t *)0x0);
  cacheDeviceInfo(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  if (local_18 != (cl_kernel)0x0) {
    getShortKernelNameWithHash_abi_cxx11_(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
    std::__cxx11::string::operator+=(in_stack_00000010,local_70);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::operator+=(in_stack_00000018,in_stack_00000010);
    pSVar3 = config(in_RDI);
    if (((pSVar3->DevicePerformanceTimeKernelInfoTracking & 1U) != 0) &&
       (local_40[0] != (cl_device_id)0x0)) {
      local_78 = std::
                 map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
                 ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
      std::__cxx11::ostringstream::ostringstream(local_1f0);
      local_1f8 = 0;
      local_200 = 0;
      local_208 = 0;
      local_210 = in_stack_00000008;
      local_214 = local_1c;
      local_220 = 0;
      if (in_stack_00000008 == (ulong *)0x0) {
        pcVar2 = dispatch(in_RDI);
        (*pcVar2->clGetKernelWorkGroupInfo)(local_18,local_40[0],0x11b0,8,&local_220,(size_t *)0x0);
        local_210 = &local_220;
        local_214 = 1;
      }
      if ((local_1f8 == 0) && ((local_78->Supports_cl_khr_subgroups & 1U) != 0)) {
        local_228 = getPlatform(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
        pCVar4 = CLIntercept::dispatchX(in_stack_fffffffffffff658,in_stack_fffffffffffff650);
        if (pCVar4->clGetKernelSubGroupInfoKHR ==
            (_func_cl_int_cl_kernel_cl_device_id_cl_kernel_sub_group_info_size_t_void_ptr_size_t_void_ptr_size_t_ptr
             *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_248,"clGetKernelSubGroupInfoKHR",&local_249);
          getExtensionFunctionAddress
                    (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          std::__cxx11::string::~string(local_248);
          std::allocator<char>::~allocator((allocator<char> *)&local_249);
        }
        local_258 = CLIntercept::dispatchX(in_stack_fffffffffffff658,in_stack_fffffffffffff650);
        if (local_258->clGetKernelSubGroupInfoKHR !=
            (_func_cl_int_cl_kernel_cl_device_id_cl_kernel_sub_group_info_size_t_void_ptr_size_t_void_ptr_size_t_ptr
             *)0x0) {
          in_stack_fffffffffffff638 = (cl_device_id)&local_1f8;
          in_stack_fffffffffffff640 = (CLIntercept *)0x0;
          (*local_258->clGetKernelSubGroupInfoKHR)
                    (local_18,local_40[0],0x2033,(ulong)local_214 << 3,local_210,8,
                     in_stack_fffffffffffff638,(size_t *)0x0);
        }
      }
      if (((local_1f8 == 0) && (0x800fff < local_78->NumericVersion)) &&
         (pcVar2 = dispatch(in_RDI),
         pcVar2->clGetKernelSubGroupInfo != (cl_api_clGetKernelSubGroupInfo)0x0)) {
        pcVar2 = dispatch(in_RDI);
        in_stack_fffffffffffff638 = (cl_device_id)&local_1f8;
        in_stack_fffffffffffff640 = (CLIntercept *)0x0;
        (*pcVar2->clGetKernelSubGroupInfo)
                  (local_18,local_40[0],0x2033,(ulong)local_214 << 3,local_210,8,
                   in_stack_fffffffffffff638,(size_t *)0x0);
      }
      pcVar2 = dispatch(in_RDI);
      (*pcVar2->clGetKernelWorkGroupInfo)(local_18,local_40[0],0x11b3,8,&local_200,(size_t *)0x0);
      if (local_1f8 == 0) {
        local_888 = local_200;
      }
      else {
        local_888 = local_1f8;
      }
      local_1f8 = local_888;
      if (local_200 == 0) {
        local_890 = local_888;
      }
      else {
        local_890 = local_200;
      }
      local_200 = local_890;
      if (local_888 < local_890) {
        local_898 = local_888;
      }
      else {
        local_898 = local_890;
      }
      local_208 = local_898;
      if (local_898 != 0) {
        poVar5 = std::operator<<((ostream *)local_1f0," SIMD");
        std::ostream::operator<<(poVar5,local_208);
      }
      local_25c = 0;
      pcVar2 = dispatch(in_RDI);
      (*pcVar2->clGetKernelWorkGroupInfo)(local_18,local_40[0],0x425b,4,&local_25c,(size_t *)0x0);
      if (local_25c != 0) {
        poVar5 = std::operator<<((ostream *)local_1f0," REG");
        std::ostream::operator<<(poVar5,local_25c);
      }
      local_268 = 0;
      pcVar2 = dispatch(in_RDI);
      (*pcVar2->clGetKernelWorkGroupInfo)(local_18,local_40[0],0x11b2,8,&local_268,(size_t *)0x0);
      if (local_268 != 0) {
        poVar5 = std::operator<<((ostream *)local_1f0," SLM=");
        std::ostream::operator<<(poVar5,local_268);
      }
      local_270 = 0;
      pcVar2 = dispatch(in_RDI);
      (*pcVar2->clGetKernelWorkGroupInfo)(local_18,local_40[0],0x11b4,8,&local_270,(size_t *)0x0);
      if (local_270 != 0) {
        poVar5 = std::operator<<((ostream *)local_1f0," TPM=");
        std::ostream::operator<<(poVar5,local_270);
      }
      local_278 = 0;
      pcVar2 = dispatch(in_RDI);
      (*pcVar2->clGetKernelWorkGroupInfo)(local_18,local_40[0],0x4109,8,&local_278,(size_t *)0x0);
      if (local_278 != 0) {
        poVar5 = std::operator<<((ostream *)local_1f0," SPILL=");
        std::ostream::operator<<(poVar5,local_278);
      }
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=(in_stack_00000018,local_298);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::ostringstream::~ostringstream(local_1f0);
    }
    pSVar3 = config(in_RDI);
    if ((pSVar3->DevicePerformanceTimeGWOTracking & 1U) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_410);
      std::operator<<((ostream *)local_410," GWO[ ");
      if (local_28 == (ulong *)0x0) {
        std::operator<<((ostream *)local_410,"NULL");
      }
      else {
        if (local_1c != 0) {
          std::ostream::operator<<(local_410,*local_28);
        }
        if (1 < local_1c) {
          poVar5 = std::operator<<((ostream *)local_410,", ");
          std::ostream::operator<<(poVar5,local_28[1]);
        }
        if (2 < local_1c) {
          poVar5 = std::operator<<((ostream *)local_410,", ");
          std::ostream::operator<<(poVar5,local_28[2]);
        }
      }
      std::operator<<((ostream *)local_410," ]");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=(in_stack_00000018,local_430);
      std::__cxx11::string::~string(local_430);
      std::__cxx11::ostringstream::~ostringstream(local_410);
    }
    pSVar3 = config(in_RDI);
    if (((pSVar3->DevicePerformanceTimeGWSTracking & 1U) != 0) && (local_30 != (ulong *)0x0)) {
      std::__cxx11::ostringstream::ostringstream(local_5a8);
      std::operator<<((ostream *)local_5a8," GWS[ ");
      if (local_1c != 0) {
        std::ostream::operator<<(local_5a8,*local_30);
      }
      if (1 < local_1c) {
        poVar5 = std::operator<<((ostream *)local_5a8," x ");
        std::ostream::operator<<(poVar5,local_30[1]);
      }
      if (2 < local_1c) {
        poVar5 = std::operator<<((ostream *)local_5a8," x ");
        std::ostream::operator<<(poVar5,local_30[2]);
      }
      std::operator<<((ostream *)local_5a8," ]");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=(in_stack_00000018,local_5c8);
      std::__cxx11::string::~string(local_5c8);
      std::__cxx11::ostringstream::~ostringstream(local_5a8);
    }
    pSVar3 = config(in_RDI);
    if ((pSVar3->DevicePerformanceTimeLWSTracking & 1U) != 0) {
      local_5c9 = 0;
      memset(local_5e8,0,0x18);
      memset(local_608,0,0x18);
      if (((in_stack_00000008 == (ulong *)0x0) && (local_1c < 4)) &&
         (pSVar3 = config(in_RDI), (pSVar3->DevicePerformanceTimeSuggestedLWSTracking & 1U) != 0)) {
        local_610 = getPlatform(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
        if ((local_5c9 & 1) == 0) {
          pCVar4 = CLIntercept::dispatchX(in_stack_fffffffffffff658,in_stack_fffffffffffff650);
          if (pCVar4->clGetKernelSuggestedLocalWorkSizeKHR ==
              (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)
              0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_630,"clGetKernelSuggestedLocalWorkSizeKHR",&local_631);
            getExtensionFunctionAddress
                      (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18
                      );
            std::__cxx11::string::~string(local_630);
            std::allocator<char>::~allocator((allocator<char> *)&local_631);
          }
          local_640 = CLIntercept::dispatchX(in_stack_fffffffffffff658,in_stack_fffffffffffff650);
          if (local_640->clGetKernelSuggestedLocalWorkSizeKHR !=
              (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)
              0x0) {
            local_644 = (*local_640->clGetKernelSuggestedLocalWorkSizeKHR)
                                  (local_10,local_18,local_1c,local_28,local_30,local_5e8);
            local_5c9 = local_644 == 0;
          }
        }
        if ((local_5c9 & 1) == 0) {
          pCVar4 = CLIntercept::dispatchX(in_stack_fffffffffffff658,in_stack_fffffffffffff650);
          if (pCVar4->clGetKernelSuggestedLocalWorkSizeINTEL ==
              (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)
              0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_668,"clGetKernelSuggestedLocalWorkSizeINTEL",&local_669);
            getExtensionFunctionAddress
                      (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18
                      );
            std::__cxx11::string::~string(local_668);
            std::allocator<char>::~allocator((allocator<char> *)&local_669);
          }
          pCVar4 = CLIntercept::dispatchX(in_stack_fffffffffffff658,in_stack_fffffffffffff650);
          if (pCVar4->clGetKernelSuggestedLocalWorkSizeINTEL !=
              (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)
              0x0) {
            if (local_28 == (ulong *)0x0) {
              local_998 = local_608;
            }
            else {
              local_998 = local_28;
            }
            cVar1 = (*pCVar4->clGetKernelSuggestedLocalWorkSizeINTEL)
                              (local_10,local_18,local_1c,local_998,local_30,local_5e8);
            local_5c9 = cVar1 == 0;
          }
        }
      }
      std::__cxx11::ostringstream::ostringstream(local_7f8);
      if ((local_5c9 & 1) == 0) {
        std::operator<<((ostream *)local_7f8," LWS[ ");
      }
      else {
        std::operator<<((ostream *)local_7f8," SLWS[ ");
        in_stack_00000008 = local_5e8;
      }
      if (in_stack_00000008 == (ulong *)0x0) {
        std::operator<<((ostream *)local_7f8,"NULL");
      }
      else {
        if (local_1c != 0) {
          std::ostream::operator<<(local_7f8,*in_stack_00000008);
        }
        if (1 < local_1c) {
          poVar5 = std::operator<<((ostream *)local_7f8," x ");
          std::ostream::operator<<(poVar5,in_stack_00000008[1]);
        }
        if (2 < local_1c) {
          poVar5 = std::operator<<((ostream *)local_7f8," x ");
          std::ostream::operator<<(poVar5,in_stack_00000008[2]);
        }
      }
      std::operator<<((ostream *)local_7f8," ]");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=(in_stack_00000018,local_818);
      std::__cxx11::string::~string(local_818);
      std::__cxx11::ostringstream::~ostringstream(local_7f8);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x205bbf);
  return;
}

Assistant:

void CLIntercept::getTimingTagsKernel(
    const cl_command_queue queue,
    const cl_kernel kernel,
    const cl_uint workDim,
    const size_t* gwo,
    const size_t* gws,
    const size_t* lws,
    std::string& hostTag,
    std::string& deviceTag )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_device_id device = NULL;
    dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_DEVICE,
        sizeof(device),
        &device,
        NULL );

    // Cache the device info if it's not cached already, since we'll print
    // the device name and other device properties as part of the report.
    cacheDeviceInfo( device );

    if( kernel )
    {
        hostTag += getShortKernelNameWithHash(kernel);

        deviceTag += hostTag;

        if( config().DevicePerformanceTimeKernelInfoTracking && device )
        {
            const SDeviceInfo& deviceInfo = m_DeviceInfoMap[device];

            std::ostringstream  ss;
            {
                size_t  maxsgs = 0;
                size_t  pwgsm = 0;
                size_t  simd = 0;

                // Use the kernel "max subgroup size" and "preferred work
                // group size multiple" to get a reasonable estimate of
                // the kernel "SIMD size".  We'll try to query both values,
                // and if both queries are successful, we'll pick the
                // smallest one.  Empirically, this is reasonably accurate.

                // First, query the "max subgroup size":

                // The query for the max subgroup size requires passing in
                // a local work size.  We'll use the local work size provided
                // by the app if there is one, otherwise we will query the
                // max local work size for this kernel and use it.
                const size_t*   queryLWS = lws;
                cl_uint queryWorkDim = workDim;

                size_t  kwgs = 0;
                if( queryLWS == NULL )
                {
                    dispatch().clGetKernelWorkGroupInfo(
                        kernel,
                        device,
                        CL_KERNEL_WORK_GROUP_SIZE,
                        sizeof(kwgs),
                        &kwgs,
                        NULL );
                    queryLWS = &kwgs;
                    queryWorkDim = 1;
                }

                if( maxsgs == 0 &&
                    deviceInfo.Supports_cl_khr_subgroups )
                {
                    cl_platform_id  platform = getPlatform(device);
                    if( dispatchX(platform).clGetKernelSubGroupInfoKHR == NULL )
                    {
                        getExtensionFunctionAddress(
                            platform,
                            "clGetKernelSubGroupInfoKHR" );
                    }

                    const auto& dispatchX = this->dispatchX(platform);
                    if( dispatchX.clGetKernelSubGroupInfoKHR )
                    {
                        dispatchX.clGetKernelSubGroupInfoKHR(
                            kernel,
                            device,
                            CL_KERNEL_MAX_SUB_GROUP_SIZE_FOR_NDRANGE_KHR,
                            queryWorkDim * sizeof(queryLWS[0]),
                            queryLWS,
                            sizeof(maxsgs),
                            &maxsgs,
                            NULL );
                    }
                }
                if( maxsgs == 0 &&
                    deviceInfo.NumericVersion >= CL_MAKE_VERSION_KHR(2, 1, 0) &&
                    dispatch().clGetKernelSubGroupInfo )
                {
                    dispatch().clGetKernelSubGroupInfo(
                        kernel,
                        device,
                        CL_KERNEL_MAX_SUB_GROUP_SIZE_FOR_NDRANGE,
                        queryWorkDim * sizeof(queryLWS[0]),
                        queryLWS,
                        sizeof(maxsgs),
                        &maxsgs,
                        NULL );
                }

                // Next, query the "preferred work group size multiple":

                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_PREFERRED_WORK_GROUP_SIZE_MULTIPLE,
                    sizeof(pwgsm),
                    &pwgsm,
                    NULL );

                // If either query is zero, use the other query.
                // Otherwise, use the smallest query.

                maxsgs = ( maxsgs == 0 ) ? pwgsm : maxsgs;
                pwgsm = ( pwgsm == 0 ) ? maxsgs : pwgsm;
                simd = ( maxsgs < pwgsm ) ? maxsgs : pwgsm;

                if( simd )
                {
                    ss << " SIMD" << simd;
                }
            }
            {
                cl_uint regCount = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_REGISTER_COUNT_INTEL,
                    sizeof(regCount),
                    &regCount,
                    NULL );
                if( regCount )
                {
                    ss << " REG" << regCount;
                }
            }
            {
                cl_ulong slm = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_LOCAL_MEM_SIZE,
                    sizeof(slm),
                    &slm,
                    NULL );
                if( slm )
                {
                    ss << " SLM=" << slm;
                }
            }
            {
                cl_ulong tpm = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_PRIVATE_MEM_SIZE,
                    sizeof(tpm),
                    &tpm,
                    NULL );
                if( tpm )
                {
                    ss << " TPM=" << tpm;
                }
            }
            {
                cl_ulong spill = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_SPILL_MEM_SIZE_INTEL,
                    sizeof(spill),
                    &spill,
                    NULL );
                if( spill )
                {
                    ss << " SPILL=" << spill;
                }
            }
            deviceTag += ss.str();
        }

        if( config().DevicePerformanceTimeGWOTracking )
        {
            std::ostringstream  ss;
            ss << " GWO[ ";
            if( gwo )
            {
                if( workDim >= 1 )
                {
                    ss << gwo[0];
                }
                if( workDim >= 2 )
                {
                    ss << ", " << gwo[1];
                }
                if( workDim >= 3 )
                {
                    ss << ", " << gwo[2];
                }
            }
            else
            {
                ss << "NULL";
            }
            ss << " ]";
            deviceTag += ss.str();
        }

        if( config().DevicePerformanceTimeGWSTracking && gws )
        {
            std::ostringstream  ss;
            ss << " GWS[ ";
            if( workDim >= 1 )
            {
                ss << gws[0];
            }
            if( workDim >= 2 )
            {
                ss << " x " << gws[1];
            }
            if( workDim >= 3 )
            {
                ss << " x " << gws[2];
            }
            ss << " ]";
            deviceTag += ss.str();
        }

        if( config().DevicePerformanceTimeLWSTracking )
        {
            bool    useSuggestedLWS = false;
            size_t  suggestedLWS[3] = { 0, 0, 0 };
            size_t  emptyGWO[3] = { 0, 0, 0 };

            if( lws == NULL &&
                workDim <= 3 &&
                config().DevicePerformanceTimeSuggestedLWSTracking )
            {
                cl_platform_id  platform = getPlatform(device);

                // Try the cl_khr_suggested_local_work_size version first.
                if( useSuggestedLWS == false )
                {
                    if( dispatchX(platform).clGetKernelSuggestedLocalWorkSizeKHR == NULL )
                    {
                        getExtensionFunctionAddress(
                            platform,
                            "clGetKernelSuggestedLocalWorkSizeKHR" );
                    }

                    const auto& dispatchX = this->dispatchX(platform);
                    if( dispatchX.clGetKernelSuggestedLocalWorkSizeKHR )
                    {
                        cl_int testErrorCode = dispatchX.clGetKernelSuggestedLocalWorkSizeKHR(
                            queue,
                            kernel,
                            workDim,
                            gwo,
                            gws,
                            suggestedLWS );
                        useSuggestedLWS = ( testErrorCode == CL_SUCCESS );
                    }
                }

                // If this fails, try the unofficial Intel version next.
                if( useSuggestedLWS == false )
                {
                    if( dispatchX(platform).clGetKernelSuggestedLocalWorkSizeINTEL == NULL )
                    {
                        getExtensionFunctionAddress(
                            platform,
                            "clGetKernelSuggestedLocalWorkSizeINTEL" );
                    }

                    const auto& dispatchX = this->dispatchX(platform);
                    if( dispatchX.clGetKernelSuggestedLocalWorkSizeINTEL )
                    {
                        cl_int testErrorCode = dispatchX.clGetKernelSuggestedLocalWorkSizeINTEL(
                            queue,
                            kernel,
                            workDim,
                            gwo == NULL ? emptyGWO : gwo,
                            gws,
                            suggestedLWS );
                        useSuggestedLWS = ( testErrorCode == CL_SUCCESS );
                    }
                }
            }

            std::ostringstream  ss;
            if( useSuggestedLWS )
            {
                ss << " SLWS[ ";
                lws = suggestedLWS;
            }
            else
            {
                ss << " LWS[ ";
            }

            if( lws )
            {
                if( workDim >= 1 )
                {
                    ss << lws[0];
                }
                if( workDim >= 2 )
                {
                    ss << " x " << lws[1];
                }
                if( workDim >= 3 )
                {
                    ss << " x " << lws[2];
                }
            }
            else
            {
                ss << "NULL";
            }

            ss << " ]";
            deviceTag += ss.str();
        }
    }
}